

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::GetFriction(sector_t *this,int plane,double *pMoveFac)

{
  FTerrainDef *pFVar1;
  unsigned_short uVar2;
  double dVar4;
  uint uVar3;
  
  pFVar1 = Terrains.Array;
  if ((this->Flags & 0x10) == 0) {
    uVar3 = this->terrainnum[plane];
    if ((int)uVar3 < 0) {
      uVar3 = this->planes[plane].Texture.texnum;
      if ((TerrainTypes.Types.Count <= uVar3) ||
         (uVar2 = TerrainTypes.Types.Array[(int)uVar3],
         TerrainTypes.Types.Array[(int)uVar3] == 0xffff)) {
        uVar2 = DefaultTerrainType;
      }
      uVar3 = (uint)uVar2;
    }
    if ((Terrains.Array[uVar3].Friction != 0.0) || (NAN(Terrains.Array[uVar3].Friction))) {
      if (pMoveFac != (double *)0x0) {
        *pMoveFac = Terrains.Array[uVar3].MoveFactor;
      }
      return pFVar1[uVar3].Friction;
    }
    dVar4 = 0.90625;
    if (pMoveFac != (double *)0x0) {
      *pMoveFac = 0.03125;
      return dVar4;
    }
  }
  else {
    if (pMoveFac != (double *)0x0) {
      *pMoveFac = this->movefactor;
    }
    dVar4 = this->friction;
  }
  return dVar4;
}

Assistant:

double sector_t::GetFriction(int plane, double *pMoveFac) const
{
	if (Flags & SECF_FRICTION) 
	{ 
		if (pMoveFac) *pMoveFac = movefactor;
		return friction; 
	}
	FTerrainDef *terrain = &Terrains[GetTerrain(plane)];
	if (terrain->Friction != 0)
	{
		if (pMoveFac) *pMoveFac = terrain->MoveFactor;
		return terrain->Friction;
	}
	else
	{
		if (pMoveFac) *pMoveFac = ORIG_FRICTION_FACTOR;
		return ORIG_FRICTION;
	}
}